

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

source_position
mjs::calc_source_position
          (wstring_view *t,uint32_t start_pos,uint32_t end_pos,source_position *start)

{
  int iVar1;
  bool bVar2;
  source_position sVar3;
  size_type sVar4;
  ulong uVar5;
  const_reference pvVar6;
  int *piVar7;
  uint32_t local_3c;
  uint32_t i;
  int tabstop;
  int column;
  int lf;
  int cr;
  source_position *start_local;
  uint32_t end_pos_local;
  uint32_t start_pos_local;
  wstring_view *t_local;
  
  _lf = start;
  start_local._0_4_ = end_pos;
  start_local._4_4_ = start_pos;
  _end_pos_local = t;
  sVar4 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size(t);
  bVar2 = false;
  if (start_pos <= sVar4) {
    uVar5 = (ulong)(uint32_t)start_local;
    sVar4 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size(_end_pos_local);
    bVar2 = false;
    if (uVar5 <= sVar4) {
      bVar2 = start_local._4_4_ <= (uint32_t)start_local;
    }
  }
  if (!bVar2) {
    __assert_fail("start_pos <= t.size() && end_pos <= t.size() && start_pos <= end_pos",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                  ,0x2e,
                  "source_position mjs::calc_source_position(const std::wstring_view &, uint32_t, uint32_t, const source_position &)"
                 );
  }
  column = _lf->line + -1;
  tabstop = _lf->line + -1;
  i = _lf->column - 1;
  for (local_3c = start_local._4_4_; local_3c < (uint32_t)start_local; local_3c = local_3c + 1) {
    pvVar6 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                       (_end_pos_local,(ulong)local_3c);
    iVar1 = *pvVar6;
    if (iVar1 == 9) {
      i = (8 - (int)i % 8) + i;
    }
    else if (iVar1 == 10) {
      tabstop = tabstop + 1;
      i = 0;
    }
    else if (iVar1 == 0xd) {
      column = column + 1;
      i = 0;
    }
    else {
      i = i + 1;
    }
  }
  piVar7 = std::max<int>(&column,&tabstop);
  sVar3.column = i + 1;
  sVar3.line = *piVar7 + 1;
  return sVar3;
}

Assistant:

source_position calc_source_position(const std::wstring_view& t, uint32_t start_pos, uint32_t end_pos, const source_position& start) {
    assert(start_pos <= t.size() && end_pos <= t.size() && start_pos <= end_pos);
    int cr = start.line-1, lf = start.line-1;
    int column = start.column-1;
    constexpr int tabstop = 8;
    for (uint32_t i = start_pos; i < end_pos; ++i) {
        switch (t[i]) {
        case '\n': ++lf; column = 0; break;
        case '\r': ++cr; column = 0; break;
        case '\t': column += tabstop - (column % tabstop); break;
        default: ++column;
        }
    }
    return {1 + std::max(cr, lf), 1 + column};
}